

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Fts5HashEntry * fts5HashEntryMerge(Fts5HashEntry *pLeft,Fts5HashEntry *pRight)

{
  Fts5HashEntry *pFVar1;
  Fts5HashEntry *pFVar2;
  Fts5HashEntry *pFVar3;
  Fts5HashEntry *in_RSI;
  Fts5HashEntry *in_RDI;
  long in_FS_OFFSET;
  int cmp;
  int nMin;
  char *zKey2;
  char *zKey1;
  Fts5HashEntry **ppOut;
  Fts5HashEntry *p2;
  Fts5HashEntry *p1;
  Fts5HashEntry *pRet;
  int local_58;
  int local_50;
  Fts5HashEntry **local_38;
  Fts5HashEntry *local_30;
  Fts5HashEntry *local_28;
  Fts5HashEntry *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = (Fts5HashEntry *)0x0;
  local_38 = &local_10;
  local_30 = in_RSI;
  local_28 = in_RDI;
  while (local_28 != (Fts5HashEntry *)0x0 || local_30 != (Fts5HashEntry *)0x0) {
    if (local_28 == (Fts5HashEntry *)0x0) {
      *local_38 = local_30;
      local_30 = (Fts5HashEntry *)0x0;
    }
    else if (local_30 == (Fts5HashEntry *)0x0) {
      *local_38 = local_28;
      local_28 = (Fts5HashEntry *)0x0;
    }
    else {
      if (local_28->nKey < local_30->nKey) {
        local_58 = local_28->nKey;
      }
      else {
        local_58 = local_30->nKey;
      }
      local_50 = memcmp(local_28 + 1,local_30 + 1,(long)local_58);
      if (local_50 == 0) {
        local_50 = local_28->nKey - local_30->nKey;
      }
      if (local_50 < 1) {
        *local_38 = local_28;
        pFVar2 = local_30;
        pFVar3 = local_28->pScanNext;
        pFVar1 = local_28;
      }
      else {
        *local_38 = local_30;
        pFVar2 = local_30->pScanNext;
        pFVar3 = local_28;
        pFVar1 = local_30;
      }
      local_28 = pFVar3;
      local_30 = pFVar2;
      local_38 = &pFVar1->pScanNext;
      *local_38 = (Fts5HashEntry *)0x0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

static Fts5HashEntry *fts5HashEntryMerge(
  Fts5HashEntry *pLeft,
  Fts5HashEntry *pRight
){
  Fts5HashEntry *p1 = pLeft;
  Fts5HashEntry *p2 = pRight;
  Fts5HashEntry *pRet = 0;
  Fts5HashEntry **ppOut = &pRet;

  while( p1 || p2 ){
    if( p1==0 ){
      *ppOut = p2;
      p2 = 0;
    }else if( p2==0 ){
      *ppOut = p1;
      p1 = 0;
    }else{
      char *zKey1 = fts5EntryKey(p1);
      char *zKey2 = fts5EntryKey(p2);
      int nMin = MIN(p1->nKey, p2->nKey);

      int cmp = memcmp(zKey1, zKey2, nMin);
      if( cmp==0 ){
        cmp = p1->nKey - p2->nKey;
      }
      assert( cmp!=0 );

      if( cmp>0 ){
        /* p2 is smaller */
        *ppOut = p2;
        ppOut = &p2->pScanNext;
        p2 = p2->pScanNext;
      }else{
        /* p1 is smaller */
        *ppOut = p1;
        ppOut = &p1->pScanNext;
        p1 = p1->pScanNext;
      }
      *ppOut = 0;
    }
  }

  return pRet;
}